

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_set_bias(katherine_device_t *device,uchar bias_id,float bias_value)

{
  int local_24;
  int res;
  float bias_value_local;
  uchar bias_id_local;
  katherine_device_t *device_local;
  
  local_24 = katherine_udp_mutex_lock(&device->control_socket);
  if (((local_24 == 0) &&
      (local_24 = katherine_cmd_set_bias_settings(&device->control_socket,bias_value), local_24 == 0
      )) && (local_24 = katherine_cmd_wait_ack(&device->control_socket), local_24 == 0)) {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = 0;
  }
  else {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = local_24;
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_set_bias(katherine_device_t *device, unsigned char bias_id, float bias_value)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    // TODO use bias_id

    res = katherine_cmd_set_bias_settings(&device->control_socket, bias_value);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}